

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

ScatterOut * __thiscall
cert::Metal::scatter
          (ScatterOut *__return_storage_ptr__,Metal *this,Vec3 point,Vec3 normal,UV uv,Ray *r_in,
          PRNG *random)

{
  float fVar1;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  Vec3 local_30;
  
  local_40.z = normal.z;
  local_40._0_8_ = normal._0_8_;
  local_30.z = point.z;
  local_30._0_8_ = point._0_8_;
  local_60 = normalize(&r_in->direction);
  local_50 = reflect(&local_60,&local_40);
  __return_storage_ptr__->is_scattered =
       0.0 < local_50.z * local_40.z + local_40.x * local_50.x + local_50.y * local_40.y;
  fVar1 = (this->super_Material).albedo.y;
  (__return_storage_ptr__->attenuation).x = (this->super_Material).albedo.x;
  (__return_storage_ptr__->attenuation).y = fVar1;
  (__return_storage_ptr__->attenuation).z = (this->super_Material).albedo.z;
  Ray::Ray(&__return_storage_ptr__->scattered,&local_30,&local_50);
  __return_storage_ptr__->index = -1.0;
  Ray::Ray(&__return_storage_ptr__->refracted,(Vec3 *)VEC3_ZERO,(Vec3 *)VEC3_RIGHT);
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 reflected = reflect (normalize (r_in.direction), normal);
		return { .is_scattered = dot (reflected, normal) > 0.0,
			.attenuation = albedo,
			.scattered = Ray (point, reflected) };
	}